

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int ncnn::convolutiondepthwise
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,int group,
              int activation_type,Mat *activation_params,Option *opt)

{
  int *piVar1;
  size_t *psVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  float *pfVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float *pfVar13;
  pointer piVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint extraout_EAX;
  float *pfVar18;
  float *extraout_RAX;
  float *extraout_RAX_00;
  int iVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  size_type __n;
  float *pfVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  void *pvVar28;
  void *pvVar29;
  void *pvVar30;
  float *pfVar31;
  void *pvVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vector<int,_std::allocator<int>_> _space_ofs;
  float *local_158;
  void *local_140;
  allocator_type local_131;
  void *local_130;
  float *local_128;
  Mat *local_120;
  float *local_118;
  float *local_110;
  void *local_108;
  void *local_100;
  uint local_f4;
  float *local_f0;
  void *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  void *local_c8;
  long local_c0;
  int local_b4;
  Mat *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  long local_88;
  void *local_80;
  ulong local_78;
  long local_70;
  void *local_68;
  long local_60;
  ulong local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  if (bias_data->data == (void *)0x0) {
    bVar33 = true;
  }
  else {
    bVar33 = (long)bias_data->c * bias_data->cstep == 0;
  }
  iVar19 = bottom_blob->w;
  local_100 = (void *)(long)top_blob->w;
  local_e8 = (void *)(ulong)(uint)top_blob->h;
  iVar4 = bottom_blob->c;
  iVar5 = top_blob->c;
  uVar15 = kernel_h * kernel_w;
  __n = (size_type)(int)uVar15;
  local_120 = bottom_blob;
  local_b0 = bias_data;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_131);
  piVar14 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (0 < kernel_h) {
    iVar21 = 0;
    iVar23 = 0;
    iVar25 = 0;
    do {
      if (0 < kernel_w) {
        lVar27 = 0;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar21 + lVar27] = iVar23;
          iVar23 = iVar23 + dilation_w;
          lVar27 = lVar27 + 1;
        } while (kernel_w != (int)lVar27);
        iVar21 = iVar21 + (int)lVar27;
      }
      iVar23 = iVar23 + (iVar19 * dilation_h - dilation_w * kernel_w);
      iVar25 = iVar25 + 1;
    } while (iVar25 != kernel_h);
  }
  local_128 = (float *)(ulong)(uint)activation_type;
  if (iVar5 == group && iVar4 == group) {
    uVar17 = activation_type;
    if (0 < group) {
      local_f0 = (float *)top_blob->data;
      local_c0 = top_blob->cstep * top_blob->elemsize;
      pvVar32 = weight_data->data;
      piVar1 = &local_120->w;
      local_c8 = local_120->data;
      psVar2 = &local_120->elemsize;
      local_120 = (Mat *)(local_120->cstep * *psVar2);
      pvVar28 = (void *)(long)stride_w;
      local_a8._0_8_ = (long)stride_h * (long)*piVar1 * *psVar2;
      local_118 = (float *)(ulong)(uint)group;
      local_158 = (float *)0x0;
      pfVar18 = (float *)(ulong)(activation_type - 1);
      pvVar29 = local_100;
      local_130 = pvVar28;
      local_128 = pfVar18;
      do {
        if (0 < (int)local_e8) {
          local_110 = (float *)((long)local_120 * (long)local_158 + (long)local_c8);
          pfVar31 = (float *)(local_c0 * (long)local_158 + (long)local_f0);
          local_108 = (void *)0x0;
          pfVar18 = local_158;
          pfVar24 = local_128;
          do {
            pfVar13 = local_110;
            if (0 < (int)pvVar29) {
              pvVar7 = local_b0->data;
              lVar27 = (long)local_108 * local_a8._0_8_;
              pfVar8 = (float *)activation_params->data;
              pvVar30 = (void *)0x0;
              pfVar18 = pfVar8;
              do {
                uVar20 = 0;
                if (!bVar33) {
                  uVar20 = (ulong)*(uint *)((long)pvVar7 + (long)local_158 * 4);
                  pfVar18 = local_158;
                }
                auVar37._8_8_ = 0;
                auVar37._0_8_ = uVar20;
                if (0 < (int)uVar15) {
                  pfVar18 = (float *)((long)pfVar13 + (long)pvVar30 * (long)pvVar28 * 4 + lVar27);
                  uVar20 = 0;
                  do {
                    auVar37._0_4_ =
                         auVar37._0_4_ +
                         *(float *)((long)pvVar32 + uVar20 * 4) * pfVar18[piVar14[uVar20]];
                    uVar20 = uVar20 + 1;
                  } while (uVar15 != uVar20);
                }
                fVar34 = auVar37._0_4_;
                if ((uint)pfVar24 < 6) {
                  pfVar18 = (float *)((long)&switchD_003f5a86::switchdataD_005a1a88 +
                                     (long)(int)(&switchD_003f5a86::switchdataD_005a1a88)
                                                [(long)pfVar24]);
                  switch(pfVar18) {
                  case (float *)0x3f5a88:
                    if (fVar34 <= 0.0) {
                      auVar11._12_4_ = 0;
                      auVar11._0_12_ = auVar37._4_12_;
                      auVar37 = auVar11 << 0x20;
                    }
                    goto LAB_003f5a90;
                  case (float *)0x3f5a98:
                    local_98 = auVar37;
                    fVar34 = expf(fVar34);
                    fVar34 = logf(fVar34 + 1.0);
                    fVar34 = tanhf(fVar34);
                    pfVar18 = extraout_RAX;
                    pfVar24 = local_128;
                    pvVar28 = local_130;
                    pvVar29 = local_100;
                    fVar35 = fVar34 * (float)local_98._0_4_;
                    break;
                  case (float *)0x3f5ae6:
                    if (fVar34 <= *pfVar8) {
                      auVar37._0_4_ = *pfVar8;
                    }
                    fVar35 = pfVar8[1];
                    pfVar18 = pfVar8;
                    if (auVar37._0_4_ <= fVar35) {
                      fVar35 = auVar37._0_4_;
                    }
                    break;
                  case (float *)0x3f5b05:
                    if (88.37626 <= fVar34) {
                      fVar34 = 88.37626;
                    }
                    fVar34 = expf((float)(-(uint)(fVar34 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar34 < -88.37626) & (uint)-fVar34));
                    pfVar18 = extraout_RAX_00;
                    pfVar24 = local_128;
                    pvVar28 = local_130;
                    pvVar29 = local_100;
                    fVar35 = 1.0 / (fVar34 + 1.0);
                    break;
                  case (float *)0x3f5b6b:
                    fVar35 = (float)(~-(uint)(0.0 < fVar34) & (uint)*pfVar8 |
                                    -(uint)(0.0 < fVar34) & 0x3f800000) * fVar34;
                    pfVar18 = pfVar8;
                    break;
                  case (float *)0x3f5b96:
                    fVar3 = *pfVar8;
                    fVar36 = -pfVar8[1] / fVar3;
                    pfVar18 = pfVar8;
                    fVar35 = 0.0;
                    if (fVar36 <= fVar34) {
                      if (fVar36 + 1.0 / fVar3 < fVar34) goto LAB_003f5a90;
                      fVar35 = (fVar3 * fVar34 + pfVar8[1]) * fVar34;
                    }
                  }
                }
                else {
LAB_003f5a90:
                  fVar35 = auVar37._0_4_;
                }
                pfVar31[(long)pvVar30] = fVar35;
                pvVar30 = (void *)((long)pvVar30 + 1);
              } while (pvVar30 != pvVar29);
            }
            pfVar31 = pfVar31 + (long)pvVar29;
            local_108 = (void *)((long)local_108 + 1);
          } while (local_108 != local_e8);
        }
        uVar17 = (uint)pfVar18;
        local_158 = (float *)((long)local_158 + 1);
        pvVar32 = (void *)((long)pvVar32 + __n * 4);
      } while (local_158 != local_118);
    }
  }
  else {
    uVar16 = iVar4 / group;
    uVar17 = iVar5 / group;
    local_f4 = uVar17;
    if (0 < group) {
      local_68 = top_blob->data;
      local_70 = top_blob->cstep * top_blob->elemsize;
      local_80 = weight_data->data;
      uVar6 = top_blob->w;
      local_f0 = (float *)(ulong)(uint)top_blob->h;
      local_c0 = (long)(int)uVar6;
      local_98._0_8_ = (long)stride_w;
      local_c8 = (void *)(long)stride_h;
      local_88 = (long)(int)uVar17;
      local_78 = (ulong)(uint)group;
      local_58 = (ulong)uVar17;
      local_b4 = uVar16 * uVar17 * uVar15;
      local_50 = (long)(int)(uVar16 * uVar15) << 2;
      local_d8 = 0;
      local_e0 = 0;
      do {
        if (0 < (int)local_f4) {
          local_130 = (void *)((long)local_80 + (long)(int)local_d8 * 4);
          local_60 = local_e0 * local_88;
          iVar19 = (int)local_e0;
          local_d0 = 0;
          do {
            if (0 < (int)local_f0) {
              local_e8 = (void *)(local_d0 + local_60);
              local_140 = (void *)(local_70 * (long)local_e8 + (long)local_68);
              local_118 = (float *)0x0;
              do {
                if (0 < (int)uVar6) {
                  local_108 = local_b0->data;
                  sVar9 = local_120->elemsize;
                  sVar10 = local_120->cstep;
                  local_100 = (void *)((long)local_118 * (long)local_c8 * (long)local_120->w * sVar9
                                      + (long)local_120->data);
                  local_110 = (float *)activation_params->data;
                  uVar20 = 0;
                  do {
                    uVar22 = 0;
                    if (!bVar33) {
                      uVar22 = (ulong)*(uint *)((long)local_108 + (long)local_e8 * 4);
                    }
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = uVar22;
                    if (0 < (int)uVar16) {
                      uVar22 = 0;
                      pvVar32 = local_130;
                      do {
                        if (0 < (int)uVar15) {
                          uVar26 = 0;
                          do {
                            auVar38._0_4_ =
                                 auVar38._0_4_ +
                                 *(float *)((long)pvVar32 + uVar26 * 4) *
                                 *(float *)((long)local_100 +
                                           (long)piVar14[uVar26] * 4 +
                                           (uVar22 + uVar16 * iVar19) * sVar10 * sVar9 +
                                           uVar20 * local_98._0_8_ * 4);
                            uVar26 = uVar26 + 1;
                          } while (uVar15 != uVar26);
                        }
                        uVar22 = uVar22 + 1;
                        pvVar32 = (void *)((long)pvVar32 + __n * 4);
                      } while (uVar22 != uVar16);
                    }
                    fVar34 = auVar38._0_4_;
                    switch(activation_type) {
                    case 1:
                      if (fVar34 <= 0.0) {
                        auVar12._12_4_ = 0;
                        auVar12._0_12_ = auVar38._4_12_;
                        auVar38 = auVar12 << 0x20;
                      }
                    default:
switchD_003f5ec0_default:
                      fVar35 = auVar38._0_4_;
                      break;
                    case 2:
                      fVar35 = (float)(~-(uint)(0.0 < fVar34) & (uint)*local_110 |
                                      -(uint)(0.0 < fVar34) & 0x3f800000) * fVar34;
                      break;
                    case 3:
                      if (fVar34 <= *local_110) {
                        auVar38._0_4_ = *local_110;
                      }
                      fVar35 = local_110[1];
                      if (auVar38._0_4_ <= fVar35) {
                        fVar35 = auVar38._0_4_;
                      }
                      break;
                    case 4:
                      if (88.37626 <= fVar34) {
                        fVar34 = 88.37626;
                      }
                      fVar34 = expf((float)(-(uint)(fVar34 < -88.37626) & 0x42b0c0a5 |
                                           ~-(uint)(fVar34 < -88.37626) & (uint)-fVar34));
                      fVar35 = 1.0 / (fVar34 + 1.0);
                      break;
                    case 5:
                      local_a8 = auVar38;
                      fVar34 = expf(fVar34);
                      fVar34 = logf(fVar34 + 1.0);
                      fVar34 = tanhf(fVar34);
                      fVar35 = fVar34 * (float)local_a8._0_4_;
                      break;
                    case 6:
                      fVar3 = *local_110;
                      fVar36 = -local_110[1] / fVar3;
                      fVar35 = 0.0;
                      if (fVar36 <= fVar34) {
                        if (fVar36 + 1.0 / fVar3 < fVar34) goto switchD_003f5ec0_default;
                        fVar35 = (fVar3 * fVar34 + local_110[1]) * fVar34;
                      }
                    }
                    *(float *)((long)local_140 + uVar20 * 4) = fVar35;
                    uVar20 = uVar20 + 1;
                  } while (uVar20 != uVar6);
                }
                local_140 = (void *)((long)local_140 + local_c0 * 4);
                local_118 = (float *)((long)local_118 + 1);
              } while (local_118 != local_f0);
            }
            local_d0 = local_d0 + 1;
            local_130 = (void *)((long)local_130 + local_50);
          } while (local_d0 != local_58);
        }
        local_e0 = local_e0 + 1;
        uVar17 = (int)local_d8 + local_b4;
        local_d8 = (ulong)uVar17;
      } while (local_e0 != local_78);
    }
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    uVar17 = extraout_EAX;
  }
  return uVar17;
}

Assistant:

static int convolutiondepthwise(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (inch == group && group == outch)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }
    else
    {
        // group convolution
        const int inch_g = inch / group;
        const int outch_g = outch / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outch_g; p++)
            {
                float* outptr = top_blob.channel(g * outch_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * inch_g * outch_g * g;

                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[outch_g * g + p];

                        const float* kptr = weight_data_ptr + maxk * inch_g * p;

                        for (int q = 0; q < inch_g; q++)
                        {
                            const Mat m = bottom_blob.channel(inch_g * g + q);
                            const float* sptr = m.row(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                float val = sptr[space_ofs[k]];
                                float w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}